

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

bool s2pred::ArePointsAntipodal(Vector3_xf *x,Vector3_xf *y)

{
  bool bVar1;
  int local_38;
  uint local_34;
  BIGNUM *local_30;
  
  bVar1 = ArePointsLinearlyDependent(x,y);
  if (bVar1) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_38,x);
    bVar1 = local_38 < 0 && (local_34 & 0xfffffffd) != 0x7ffffffd;
    BN_free(local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ArePointsAntipodal(const Vector3_xf& x, const Vector3_xf& y) {
  return ArePointsLinearlyDependent(x, y) && x.DotProd(y).sgn() < 0;
}